

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

bool CoreML::hasIOS14NeuralNetworkFeatures(Model *model)

{
  uint32 uVar1;
  bool bVar2;
  Type *pTVar3;
  LayerUnion LVar4;
  bool bVar5;
  int index;
  RepeatedPtrFieldBase *this;
  
  bVar2 = hasDefaultValueForOptionalInputs(model);
  bVar5 = true;
  if (!bVar2) {
    uVar1 = model->_oneof_case_[0];
    if (((uVar1 == 0x12f) || (uVar1 == 0x193)) || (uVar1 == 500)) {
      this = &(((model->Type_).pipeline_)->models_).super_RepeatedPtrFieldBase;
    }
    else {
      this = (RepeatedPtrFieldBase *)0x0;
    }
    if ((this != (RepeatedPtrFieldBase *)0x0) && (index = 0, 0 < this->current_size_)) {
      do {
        pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                           (this,index);
        uVar1 = pTVar3->_oneof_case_[0];
        if ((int)uVar1 < 0x3d4) {
          if (uVar1 != 0x8c) {
            if (uVar1 == 0xd2) {
LAB_0028abf5:
              if (pTVar3->_oneof_case_[0] == 0xd2) {
                LVar4 = pTVar3->layer_;
              }
              else {
                LVar4.upsample_ = Specification::UpsampleLayerParams::default_instance();
              }
              if (((LVar4.convolution_)->dilationfactor_).current_size_ != 0) {
                return true;
              }
              if (pTVar3->_oneof_case_[0] == 0xd2) {
                LVar4 = pTVar3->layer_;
              }
              else {
                LVar4.upsample_ = Specification::UpsampleLayerParams::default_instance();
              }
              if (0 < ((LVar4.convolution_)->stride_).current_size_) {
                return true;
              }
            }
            else if (uVar1 != 0x159) goto LAB_0028acc3;
            if (pTVar3->_oneof_case_[0] == 0x159) {
              LVar4 = pTVar3->layer_;
            }
            else {
              LVar4.reorganizedata_ = Specification::ReorganizeDataLayerParams::default_instance();
            }
            if (*(int *)&((LVar4.convolution_)->kernelsize_).rep_ == 2) {
              return true;
            }
          }
          if (pTVar3->_oneof_case_[0] == 0x8c) {
            LVar4 = pTVar3->layer_;
          }
          else {
            LVar4.innerproduct_ = Specification::InnerProductLayerParams::default_instance();
          }
          if ((LVar4.innerproduct_)->int8dynamicquantize_ != false) {
            return true;
          }
LAB_0028ac81:
          if (pTVar3->_oneof_case_[0] == 0x415) {
            LVar4 = pTVar3->layer_;
          }
          else {
            LVar4.batchedmatmul_ = Specification::BatchedMatMulLayerParams::default_instance();
          }
          if ((LVar4.batchedmatmul_)->int8dynamicquantize_ != false) {
            return true;
          }
LAB_0028aca2:
          if (pTVar3->_oneof_case_[0] == 0x3d4) {
            LVar4 = pTVar3->layer_;
          }
          else {
            LVar4.concatnd_ = Specification::ConcatNDLayerParams::default_instance();
          }
          if ((LVar4.concatnd_)->interleave_ != false) {
            return true;
          }
        }
        else if ((int)uVar1 < 0x415) {
          if (uVar1 == 0x3d4) goto LAB_0028aca2;
          if (uVar1 == 1000) {
            if ((pTVar3->input_).super_RepeatedPtrFieldBase.current_size_ == 7) {
              return true;
            }
            if (*(int *)&((pTVar3->layer_).convolution_)->weights_ != 0) {
              return true;
            }
            goto LAB_0028abf5;
          }
        }
        else {
          if (uVar1 == 0x415) goto LAB_0028ac81;
          if ((uVar1 - 0x5aa < 0x16) && ((0x318c21U >> (uVar1 - 0x5aa & 0x1f) & 1) != 0)) {
            return true;
          }
        }
LAB_0028acc3:
        index = index + 1;
      } while (index < this->current_size_);
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool CoreML::hasIOS14NeuralNetworkFeatures(const Specification::Model& model) {

    // Return True if the model has the new Neural network features added in
    // ios 14

    if (hasDefaultValueForOptionalInputs(model)) {
        return true;
    }


    auto layers = getNNSpec(model);
    if (layers) {
        for (int i=0; i<layers->size(); i++){
            const Specification::NeuralNetworkLayer& layer = (*layers)[i];
            switch (layer.layer_case()) {
                case Specification::NeuralNetworkLayer::kCumSum:
                case Specification::NeuralNetworkLayer::kOneHot:
                case Specification::NeuralNetworkLayer::kClampedReLU:
                case Specification::NeuralNetworkLayer::kArgSort:
                case Specification::NeuralNetworkLayer::kPooling3D:
                case Specification::NeuralNetworkLayer::kGlobalPooling3D:
                case Specification::NeuralNetworkLayer::kSliceBySize:
                case Specification::NeuralNetworkLayer::kConvolution3D:
                    return true;
                case Specification::NeuralNetworkLayer::kSliceDynamic:
                    if (layer.input().size() == 7) {
                        return true;
                    } else if (layer.slicedynamic().squeezemasks_size()) {
                        return true;
                    }
                case Specification::NeuralNetworkLayer::kUpsample:
                    if (layer.upsample().linearupsamplemode() != Specification::UpsampleLayerParams_LinearUpsampleMode_DEFAULT) {
                        return true;
                    }
                    if (layer.upsample().fractionalscalingfactor_size() > 0) {
                        return true;
                    }
                case Specification::NeuralNetworkLayer::kReorganizeData:
                    if (layer.reorganizedata().mode() == Specification::ReorganizeDataLayerParams::PIXEL_SHUFFLE) {
                      return true;
                    }
                case Specification::NeuralNetworkLayer::kInnerProduct:
                    if (layer.innerproduct().int8dynamicquantize())
                        return true;
                case Specification::NeuralNetworkLayer::kBatchedMatmul:
                    if (layer.batchedmatmul().int8dynamicquantize())
                        return true;
                case Specification::NeuralNetworkLayer::kConcatND:
                    if (layer.concatnd().interleave()) {
                        return true;
                    }
                default:
                    continue;
            }
        }
    }
    return false;
}